

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_message.h
# Opt level: O2

message<MsgType> *
blcl::net::operator>>
          (message<MsgType> *msg,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *data)

{
  pointer puVar1;
  pointer puVar2;
  
  puVar1 = (msg->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (msg->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (data->__d).__r = *(rep_conflict *)(puVar1 + -8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&msg->body,(size_type)(puVar1 + (-8 - (long)puVar2)));
  (msg->header).size =
       *(int *)&(msg->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
       *(int *)&(msg->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  return msg;
}

Assistant:

message<T>& operator>>(message<T>& msg, Data& data) {
            static_assert(std::is_standard_layout<Data>::value,
                          "Type of data is not in standard layout thus not able to be deserialized.");

            size_t i = msg.body.size() - sizeof(Data);
            // Copy the data from the vector to the variable
            std::memcpy(&data, msg.body.data() + i, sizeof(Data));
            // Resize the vector, shrink the vector size by read-out bytes, and reset the end position
            msg.body.resize(i);
            // Recalculate msg size
            msg.header.size = msg.size();

            // Return the resulting msg so that it could be chain-called.
            return msg;
        }